

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::ServiceOptions::Swap(ServiceOptions *this,ServiceOptions *other)

{
  ServiceOptions *other_local;
  ServiceOptions *this_local;
  
  if (other != this) {
    RepeatedPtrField<google::protobuf::UninterpretedOption>::Swap
              (&this->uninterpreted_option_,&other->uninterpreted_option_);
    std::swap<unsigned_int>(this->_has_bits_,other->_has_bits_);
    UnknownFieldSet::Swap(&this->_unknown_fields_,&other->_unknown_fields_);
    std::swap<int>(&this->_cached_size_,&other->_cached_size_);
    internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  }
  return;
}

Assistant:

void ServiceOptions::Swap(ServiceOptions* other) {
  if (other != this) {
    uninterpreted_option_.Swap(&other->uninterpreted_option_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
    _extensions_.Swap(&other->_extensions_);
  }
}